

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

duckdb_aggregate_function duckdb_create_aggregate_function(void)

{
  AggregateFunction *this;
  allocator local_69;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  string local_48;
  LogicalType local_28;
  
  this = (AggregateFunction *)operator_new(0x130);
  std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_3b6586a + 9,&local_69);
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(&local_28,INVALID);
  duckdb::AggregateFunction::AggregateFunction
            (this,&local_48,(vector<duckdb::LogicalType,_true> *)&local_68,&local_28,
             duckdb::CAPIAggregateStateSize,duckdb::CAPIAggregateStateInit,
             duckdb::CAPIAggregateUpdate,duckdb::CAPIAggregateCombine,duckdb::CAPIAggregateFinalize,
             (aggregate_simple_update_t)0x0,duckdb::CAPIAggregateBind,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(&local_28);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  duckdb::make_shared_ptr<duckdb::CAggregateFunctionInfo>();
  duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::
  operator=<duckdb::CAggregateFunctionInfo,_0>
            (&this->function_info,(shared_ptr<duckdb::CAggregateFunctionInfo,_true> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  return (duckdb_aggregate_function)this;
}

Assistant:

duckdb_aggregate_function duckdb_create_aggregate_function() {
	auto function = new duckdb::AggregateFunction("", {}, duckdb::LogicalType::INVALID, duckdb::CAPIAggregateStateSize,
	                                              duckdb::CAPIAggregateStateInit, duckdb::CAPIAggregateUpdate,
	                                              duckdb::CAPIAggregateCombine, duckdb::CAPIAggregateFinalize, nullptr,
	                                              duckdb::CAPIAggregateBind);
	function->function_info = duckdb::make_shared_ptr<duckdb::CAggregateFunctionInfo>();
	return reinterpret_cast<duckdb_aggregate_function>(function);
}